

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ARB_vertex_blend(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ARB_vertex_blend != 0) {
    glad_glWeightbvARB = (PFNGLWEIGHTBVARBPROC)(*load)("glWeightbvARB");
    glad_glWeightsvARB = (PFNGLWEIGHTSVARBPROC)(*load)("glWeightsvARB");
    glad_glWeightivARB = (PFNGLWEIGHTIVARBPROC)(*load)("glWeightivARB");
    glad_glWeightfvARB = (PFNGLWEIGHTFVARBPROC)(*load)("glWeightfvARB");
    glad_glWeightdvARB = (PFNGLWEIGHTDVARBPROC)(*load)("glWeightdvARB");
    glad_glWeightubvARB = (PFNGLWEIGHTUBVARBPROC)(*load)("glWeightubvARB");
    glad_glWeightusvARB = (PFNGLWEIGHTUSVARBPROC)(*load)("glWeightusvARB");
    glad_glWeightuivARB = (PFNGLWEIGHTUIVARBPROC)(*load)("glWeightuivARB");
    glad_glWeightPointerARB = (PFNGLWEIGHTPOINTERARBPROC)(*load)("glWeightPointerARB");
    glad_glVertexBlendARB = (PFNGLVERTEXBLENDARBPROC)(*load)("glVertexBlendARB");
  }
  return;
}

Assistant:

static void load_GL_ARB_vertex_blend(GLADloadproc load) {
	if(!GLAD_GL_ARB_vertex_blend) return;
	glad_glWeightbvARB = (PFNGLWEIGHTBVARBPROC)load("glWeightbvARB");
	glad_glWeightsvARB = (PFNGLWEIGHTSVARBPROC)load("glWeightsvARB");
	glad_glWeightivARB = (PFNGLWEIGHTIVARBPROC)load("glWeightivARB");
	glad_glWeightfvARB = (PFNGLWEIGHTFVARBPROC)load("glWeightfvARB");
	glad_glWeightdvARB = (PFNGLWEIGHTDVARBPROC)load("glWeightdvARB");
	glad_glWeightubvARB = (PFNGLWEIGHTUBVARBPROC)load("glWeightubvARB");
	glad_glWeightusvARB = (PFNGLWEIGHTUSVARBPROC)load("glWeightusvARB");
	glad_glWeightuivARB = (PFNGLWEIGHTUIVARBPROC)load("glWeightuivARB");
	glad_glWeightPointerARB = (PFNGLWEIGHTPOINTERARBPROC)load("glWeightPointerARB");
	glad_glVertexBlendARB = (PFNGLVERTEXBLENDARBPROC)load("glVertexBlendARB");
}